

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isChargeStrength(TokenKind kind)

{
  TokenKind kind_local;
  bool local_1;
  
  if (((kind == LargeKeyword) || (kind == MediumKeyword)) || (kind == SmallKeyword)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SyntaxFacts::isChargeStrength(TokenKind kind) {
    switch (kind) {
        case TokenKind::SmallKeyword:
        case TokenKind::MediumKeyword:
        case TokenKind::LargeKeyword:
            return true;
        default:
            return false;
    }
}